

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O0

bool __thiscall Poonam::string_id::map_database::insert(map_database *this,hash_type hash,char *str)

{
  bool bVar1;
  pointer ppVar2;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_38;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_30;
  iterator iter;
  char *str_local;
  hash_type hash_local;
  map_database *this_local;
  
  iter.
  super__Node_iterator_base<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
             )(_Node_iterator_base<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
               )str;
  str_local = (char *)hash;
  hash_local = (hash_type)this;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->strings_,(key_type *)&str_local);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->strings_);
  bVar1 = std::__detail::operator!=(&local_30,&local_38);
  if (bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                           *)&local_30);
    this_local._7_1_ =
         std::operator==(&ppVar2->second,
                         (char *)iter.
                                 super__Node_iterator_base<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                 ._M_cur);
  }
  else {
    std::
    unordered_map<unsigned_long,std::__cxx11::string,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>>
    ::emplace<unsigned_long&,char_const*&>
              ((unordered_map<unsigned_long,std::__cxx11::string,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>>
                *)&this->strings_,(unsigned_long *)&str_local,(char **)&iter);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool sid::map_database::insert(hash_type hash, const char* str) {
	auto iter = strings_.find(hash);
	if(iter != strings_.end())
		return iter->second == str;
	strings_.emplace(hash,str);
	return true;
}